

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unowned_ptr.cpp
# Opt level: O0

void __thiscall Unowned_Compare_Test::TestBody(Unowned_Compare_Test *this)

{
  bool bVar1;
  char *pcVar2;
  int *lhs;
  int *rhs;
  AssertHelper local_190;
  Message local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_8;
  unowned_ptr<int> pI2Copy;
  Message local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_7;
  unowned_ptr<int> pI2Twin;
  Message local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_6;
  Message local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_5;
  unowned_ptr<int> pI2;
  int i2;
  Message local_e8;
  int *local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_4;
  Message local_c0;
  void *local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_3;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_2;
  Message local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  Message local_58 [3];
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  unowned_ptr<int> pNone2;
  unowned_ptr<int> pNone;
  unowned_ptr<int> pI;
  int i;
  Unowned_Compare_Test *this_local;
  
  pI._p._4_4_ = 5;
  cgs::unowned_ptr<int>::unowned_ptr(&pNone,(int *)((long)&pI._p + 4));
  pNone2._p = (int *)0x0;
  cgs::unowned_ptr<int>::unowned_ptr(&pNone2);
  cgs::unowned_ptr<int>::unowned_ptr((unowned_ptr<int> *)&gtest_ar.message_,(int *)0x0);
  testing::internal::EqHelper<false>::Compare<cgs::unowned_ptr<int>,cgs::unowned_ptr<int>>
            ((EqHelper<false> *)local_40,"pNone","pNone2",&pNone2,
             (unowned_ptr<int> *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  testing::internal::CmpHelperNE<cgs::unowned_ptr<int>,cgs::unowned_ptr<int>>
            ((internal *)local_70,"pI","pNone",&pNone,&pNone2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  bVar1 = cgs::unowned_ptr::operator_cast_to_bool((unowned_ptr *)&pNone2);
  testing::internal::EqHelper<false>::Compare
            ((EqHelper<false> *)local_90,"pNone","{}",(ulong)bVar1,0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_b8 = (void *)0x0;
  testing::internal::EqHelper<false>::Compare<cgs::unowned_ptr<int>,decltype(nullptr)>
            ((EqHelper<false> *)local_b0,"pNone","nullptr",&pNone2,&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  local_e0 = (int *)((long)&pI._p + 4);
  testing::internal::EqHelper<false>::Compare<cgs::unowned_ptr<int>,int*>
            ((EqHelper<false> *)local_d8,"pI","&i",&pNone,&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff10,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff10);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  pI2._p._4_4_ = 5;
  cgs::unowned_ptr<int>::unowned_ptr
            ((unowned_ptr<int> *)&gtest_ar_5.message_,(int *)((long)&pI2._p + 4));
  testing::internal::CmpHelperNE<cgs::unowned_ptr<int>,cgs::unowned_ptr<int>>
            ((internal *)local_110,"pI","pI2",&pNone,(unowned_ptr<int> *)&gtest_ar_5.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  lhs = cgs::unowned_ptr<int>::operator*(&pNone);
  rhs = cgs::unowned_ptr<int>::operator*((unowned_ptr<int> *)&gtest_ar_5.message_);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_130,"*pI","*pI2",lhs,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pI2Twin,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pI2Twin,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pI2Twin);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  cgs::unowned_ptr<int>::unowned_ptr
            ((unowned_ptr<int> *)&gtest_ar_7.message_,(int *)((long)&pI2._p + 4));
  testing::internal::EqHelper<false>::Compare<cgs::unowned_ptr<int>,cgs::unowned_ptr<int>>
            ((EqHelper<false> *)local_158,"pI2","pI2Twin",(unowned_ptr<int> *)&gtest_ar_5.message_,
             (unowned_ptr<int> *)&gtest_ar_7.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&pI2Copy,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x48,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&pI2Copy,&local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&pI2Copy);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  gtest_ar_8.message_ = gtest_ar_5.message_;
  testing::internal::EqHelper<false>::Compare<cgs::unowned_ptr<int>,cgs::unowned_ptr<int>>
            ((EqHelper<false> *)local_180,"pI2","pI2Copy",(unowned_ptr<int> *)&gtest_ar_5.message_,
             (unowned_ptr<int> *)&gtest_ar_8.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coryshrmn[P]cgs/test/unowned_ptr.cpp"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_190,&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  return;
}

Assistant:

TEST(Unowned, Compare)
{
    int i = 5;
    unowned_ptr<int> pI { &i };
    unowned_ptr<int> pNone {};
    unowned_ptr<int> pNone2 {nullptr};
    EXPECT_EQ(pNone, pNone2);
    EXPECT_NE(pI, pNone);
    EXPECT_EQ(pNone, {});
    EXPECT_EQ(pNone, nullptr);
    EXPECT_EQ(pI, &i);

    int i2 = 5;
    unowned_ptr<int> pI2 { &i2 };
    EXPECT_NE(pI, pI2);
    EXPECT_EQ(*pI, *pI2);
    unowned_ptr<int> pI2Twin { &i2 };
    EXPECT_EQ(pI2, pI2Twin);
    unowned_ptr<int> pI2Copy { pI2 };
    EXPECT_EQ(pI2, pI2Copy);
}